

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

entrypoint * dmrC_linearize_symbol(dmr_C *C,symbol *sym)

{
  uint uVar1;
  position pVar2;
  entrypoint *ep;
  basic_block *pbVar3;
  instruction *piVar4;
  symbol *psVar5;
  pseudo_t ppVar6;
  byte *pbVar7;
  undefined8 *ptr;
  int iVar8;
  ptr_list_iter local_80;
  access_data local_68;
  allocator *local_40;
  symbol *local_38;
  
  if (sym != (symbol *)0x0) {
    C->L->current_pos = sym->pos;
    psVar5 = (sym->field_14).field_2.ctype.base_type;
    if (((psVar5 != (symbol *)0x0) && (*(char *)psVar5 == '\x05')) &&
       ((psVar5->field_14).field_2.stmt != (statement *)0x0)) {
      ep = (entrypoint *)dmrC_allocator_allocate(&C->L->entrypoint_allocator,0);
      pVar2 = sym->pos;
      pbVar3 = (basic_block *)dmrC_allocator_allocate(&C->L->basic_block_allocator,0);
      pbVar3->context = -1;
      pbVar3->pos = pVar2;
      pbVar3->ep = ep;
      uVar1 = C->L->bb_nr;
      C->L->bb_nr = uVar1 + 1;
      pbVar3->nr = uVar1;
      ep->name = sym;
      (sym->field_14).field_2.ep = ep;
      set_activeblock(C,ep,pbVar3);
      piVar4 = (instruction *)dmrC_allocator_allocate(&C->L->instruction_allocator,0);
      *(undefined4 *)piVar4 = 1;
      piVar4->pos = C->L->current_pos;
      pbVar3 = ep->active;
      if (pbVar3 != (basic_block *)0x0) {
        piVar4->bb = pbVar3;
        ptrlist_add((ptr_list **)&pbVar3->insns,piVar4,&C->ptrlist_allocator);
      }
      ep->entry = piVar4;
      ptrlist_concat((ptr_list *)(psVar5->field_14).field_2.arguments,(ptr_list **)&ep->syms);
      local_38 = psVar5;
      ptrlist_forward_iterator(&local_80,(ptr_list *)(psVar5->field_14).field_2.arguments);
      psVar5 = (symbol *)ptrlist_iter_next(&local_80);
      if (psVar5 != (symbol *)0x0) {
        local_40 = &C->ptrlist_allocator;
        iVar8 = 1;
        do {
          local_68.offset = 0;
          local_68.pos._0_4_ = 0;
          local_68.pos._4_4_ = 0;
          local_68._36_4_ = 0;
          local_68.result_type = psVar5;
          local_68.source_type = psVar5;
          local_68.address = symbol_pseudo(C,ep,psVar5);
          ppVar6 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
          piVar4 = ep->entry;
          ppVar6->type = PSEUDO_ARG;
          ppVar6->nr = iVar8;
          (ppVar6->field_5).sym = psVar5;
          ptrlist_add((ptr_list **)&(piVar4->field_6).field_0,ppVar6,local_40);
          linearize_store_gen(C,ep,ppVar6,&local_68);
          psVar5 = (symbol *)ptrlist_iter_next(&local_80);
          iVar8 = iVar8 + 1;
        } while (psVar5 != (symbol *)0x0);
      }
      psVar5 = local_38;
      ppVar6 = linearize_statement(C,ep,(local_38->field_14).field_2.stmt);
      if ((ep->active != (basic_block *)0x0) &&
         ((pbVar7 = (byte *)ptrlist_last((ptr_list *)ep->active->insns), pbVar7 == (byte *)0x0 ||
          (*pbVar7 - 9 < 0xfffffff9)))) {
        psVar5 = (psVar5->field_14).field_2.ctype.base_type;
        piVar4 = alloc_typed_instruction(C,2,psVar5);
        if ((psVar5 != (symbol *)0x0) &&
           (((0 < (psVar5->field_14).field_1.normal &&
             ((piVar4->field_6).field_4.phi_src = ppVar6, ppVar6 != (pseudo_t)0x0)) &&
            ((ppVar6->type != PSEUDO_VOID && (ppVar6->type != PSEUDO_VAL)))))) {
          ptr = (undefined8 *)dmrC_allocator_allocate(&C->L->pseudo_user_allocator,0);
          ptr[1] = &piVar4->field_6;
          *ptr = piVar4;
          ptrlist_add((ptr_list **)&ppVar6->users,ptr,&C->ptrlist_allocator);
        }
        pbVar3 = ep->active;
        if (pbVar3 != (basic_block *)0x0) {
          piVar4->bb = pbVar3;
          ptrlist_add((ptr_list **)&pbVar3->insns,piVar4,&C->ptrlist_allocator);
        }
      }
      if (2 < C->verbose) {
        printf("%s(%d): pre dmrC_kill_unreachable_bbs()\n",
               "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
               ,0x91b);
        dmrC_show_entry(C,ep);
      }
      if (C->fdump_linearize != 0) {
        if (C->fdump_linearize == 2) {
          return ep;
        }
        dmrC_show_entry(C,ep);
      }
      dmrC_kill_unreachable_bbs(C,ep);
      if (C->dbg_dead == 0) {
        return ep;
      }
      dmrC_track_pseudo_death(C,ep);
      return ep;
    }
  }
  return (entrypoint *)0x0;
}

Assistant:

struct entrypoint *dmrC_linearize_symbol(struct dmr_C *C, struct symbol *sym)
{
	struct symbol *base_type;

	if (!sym)
		return NULL;
	C->L->current_pos = sym->pos;
	base_type = sym->ctype.base_type;
	if (!base_type)
		return NULL;
	if (base_type->type == SYM_FN)
		return linearize_fn(C, sym, base_type);
	return NULL;
}